

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

bool ncnn::test_prefer_winograd63(int num_input,int num_output,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  
  if (h < w) {
    w = h;
  }
  if (num_input < 0x40) {
    if (num_input < 0x20) {
      if (num_input < 0x10) {
        if (num_output < 0x40 && 7 < num_input) {
          if (0x1f < num_output) {
            if ((w - 7U < 0x20) && ((0xff0f3cffU >> (w - 7U & 0x1f) & 1) != 0)) {
              return true;
            }
            return w - 0x2bU < 0x78;
          }
          if (0xf < num_output) {
            if ((w - 0x1fU < 0xe) && ((0x3f03U >> (w - 0x1fU & 0x1f) & 1) != 0)) {
              return true;
            }
            return w - 0x2fU < 0xa6;
          }
        }
      }
      else if (num_output < 0x40) {
        if (0x1f < num_output) {
          auVar2 = vpshufd_avx(ZEXT416((uint)w),0);
          auVar2 = vpaddd_avx(auVar2,_DAT_005f3160);
          auVar1 = vpminud_avx(auVar2,_DAT_005f4e40);
          auVar2 = vpcmpeqd_avx(auVar2,auVar1);
          if ((((auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0') {
            return true;
          }
          uVar3 = w - 0x5f;
          goto LAB_002079dc;
        }
        if (0xf < num_output) {
          auVar2 = vpshufd_avx(ZEXT416((uint)w),0);
          auVar2 = vpaddd_avx(auVar2,_DAT_005f3140);
          auVar1 = vpminud_avx(auVar2,_DAT_005f4e30);
          auVar2 = vpcmpeqd_avx(auVar2,auVar1);
          if ((w - 0x75U < 0x36 || w - 0x51U < 0x1e) ||
              ((((auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar2[0xf] < '\0')) {
            return true;
          }
          return w - 0xb1U < 6;
        }
        if (7 < num_output) {
          if (w - 0x2fU < 0x52) {
            return true;
          }
          if ((w - 0x13U < 0x1a) && ((0x30fc003U >> (w - 0x13U & 0x1f) & 1) != 0)) {
            return true;
          }
          return w - 0x9bU < 0x38;
        }
      }
    }
    else if (num_output < 0x40) {
      if (0x1f < num_output) {
        auVar2 = vpshufd_avx(ZEXT416((uint)w),0);
        auVar2 = vpaddd_avx(auVar2,_DAT_005f3160);
        auVar1 = vpminud_avx(auVar2,_DAT_005f4e50);
        auVar2 = vpcmpeqd_avx(auVar2,auVar1);
        if ((((auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0'
           ) {
          return true;
        }
        return w - 0x3fU < 0x44;
      }
      if (0xf < num_output) {
        if (w - 0x17U < 0x10) {
          return true;
        }
        if ((w - 0xdU < 0x20) && ((0xc00000c3U >> (w - 0xdU & 0x1f) & 1) != 0)) {
          return true;
        }
        uVar3 = w - 0x2f;
LAB_002079dc:
        return uVar3 < 0x5e;
      }
      if (7 < num_output) {
        if ((w - 0xbU < 0x22) && ((0x30ff0030fU >> ((ulong)(w - 0xbU) & 0x3f) & 1) != 0)) {
          return true;
        }
        return w - 0x37U < 0x6c;
      }
    }
  }
  return false;
}

Assistant:

static bool test_prefer_winograd63(int num_input, int num_output, int w, int h)
{
    // winograd selection strategy (profiled on i7-7700 single thread)

    int minwh = std::min(w, h);

    if (num_input >= 64)
    {
        return false;
    }
    if (num_input >= 32)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 56)
                                         || (minwh >= 63 && minwh <= 130);
        if (num_output >= 16) return (minwh >= 13 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 140);
        if (num_output >= 8) return (minwh >= 11 && minwh <= 14)
                                        || (minwh >= 19 && minwh <= 20)
                                        || (minwh >= 31 && minwh <= 38)
                                        || (minwh >= 43 && minwh <= 44)
                                        || (minwh >= 55 && minwh <= 162);
        return false;
    }
    if (num_input >= 16)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 19 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 92)
                                         || (minwh >= 95 && minwh <= 188);
        if (num_output >= 16) return (minwh >= 11 && minwh <= 14)
                                         || (minwh >= 27 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 74)
                                         || (minwh >= 81 && minwh <= 110)
                                         || (minwh >= 117 && minwh <= 170)
                                         || (minwh >= 177 && minwh <= 182);
        if (num_output >= 8) return (minwh >= 19 && minwh <= 20)
                                        || (minwh >= 33 && minwh <= 38)
                                        || (minwh >= 43 && minwh <= 44)
                                        || (minwh >= 47 && minwh <= 128)
                                        || (minwh >= 155 && minwh <= 210);
        return false;
    }
    if (num_input >= 8)
    {
        if (num_output >= 64) return false;
        if (num_output >= 32) return (minwh >= 7 && minwh <= 14)
                                         || (minwh >= 17 && minwh <= 20)
                                         || (minwh >= 23 && minwh <= 26)
                                         || (minwh >= 31 && minwh <= 38)
                                         || (minwh >= 43 && minwh <= 162);
        if (num_output >= 16) return minwh == 31 || minwh == 32
                                         || (minwh >= 39 && minwh <= 44)
                                         || (minwh >= 47 && minwh <= 212);
        if (num_output >= 8) return false;
        return false;
    }

    return false;
}